

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonGrow(JsonString *p,u32 N)

{
  ulong uVar1;
  char *pcVar2;
  sqlite3_uint64 n;
  
  uVar1 = p->nAlloc;
  n = (ulong)N + 10 + uVar1;
  if (N < uVar1) {
    n = uVar1 * 2;
  }
  if (p->bStatic == '\0') {
    pcVar2 = (char *)sqlite3_realloc64(p->zBuf,n);
    if (pcVar2 == (char *)0x0) goto LAB_001b5d44;
    p->zBuf = pcVar2;
  }
  else {
    if (p->bErr != '\0') {
      return 1;
    }
    pcVar2 = (char *)sqlite3_malloc64(n);
    if (pcVar2 == (char *)0x0) {
LAB_001b5d44:
      jsonOom(p);
      return 7;
    }
    memcpy(pcVar2,p->zBuf,p->nUsed);
    p->zBuf = pcVar2;
    p->bStatic = '\0';
  }
  p->nAlloc = n;
  return 0;
}

Assistant:

static int jsonGrow(JsonString *p, u32 N){
  u64 nTotal = N<p->nAlloc ? p->nAlloc*2 : p->nAlloc+N+10;
  char *zNew;
  if( p->bStatic ){
    if( p->bErr ) return 1;
    zNew = sqlite3_malloc64(nTotal);
    if( zNew==0 ){
      jsonOom(p);
      return SQLITE_NOMEM;
    }
    memcpy(zNew, p->zBuf, (size_t)p->nUsed);
    p->zBuf = zNew;
    p->bStatic = 0;
  }else{
    zNew = sqlite3_realloc64(p->zBuf, nTotal);
    if( zNew==0 ){
      jsonOom(p);
      return SQLITE_NOMEM;
    }
    p->zBuf = zNew;
  }
  p->nAlloc = nTotal;
  return SQLITE_OK;
}